

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonestack.h
# Opt level: O3

RABlockVisitItem __thiscall
asmjit::v1_14::ZoneStack<asmjit::v1_14::RABlockVisitItem>::pop
          (ZoneStack<asmjit::v1_14::RABlockVisitItem> *this)

{
  int *piVar1;
  byte bVar2;
  long lVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [16];
  Error EVar6;
  RABlock *extraout_RAX;
  RABlock *extraout_RAX_00;
  ZoneAllocator *pZVar7;
  undefined4 extraout_var;
  RABlock *pRVar8;
  ulong uVar9;
  undefined4 extraout_var_00;
  ZoneAllocator *in_RCX;
  ZoneAllocator *pZVar10;
  long *plVar11;
  long *plVar12;
  uint uVar13;
  undefined8 extraout_RDX;
  ulong uVar14;
  undefined8 extraout_RDX_00;
  ZoneAllocator *extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar15;
  undefined8 extraout_RDX_04;
  undefined8 *extraout_RDX_05;
  ZoneAllocator *pZVar16;
  ZoneAllocator *pZVar17;
  ZoneAllocator *extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined4 extraout_EDX;
  long extraout_RDX_09;
  long extraout_RDX_10;
  long lVar18;
  ulong extraout_RDX_11;
  ulong extraout_RDX_12;
  int iVar19;
  uint uVar20;
  ZoneVectorBase *unaff_RBX;
  ulong unaff_RBP;
  ZoneAllocator *in_RSI;
  long *plVar21;
  long *plVar22;
  ulong uVar23;
  uint uVar24;
  uint *puVar25;
  undefined2 uVar26;
  ZoneAllocator *in_R8;
  uint *puVar27;
  ulong uVar28;
  long lVar29;
  long *plVar30;
  ZoneAllocator *pZVar31;
  long lVar32;
  long *plVar33;
  uint uVar34;
  ulong uVar35;
  ZoneVectorBase *this_00;
  bool bVar36;
  RABlockVisitItem RVar37;
  RABlockVisitItem RVar38;
  RABlockVisitItem RVar39;
  RABlockVisitItem RVar40;
  RABlockVisitItem RVar41;
  RABlockVisitItem RVar42;
  RABlockVisitItem RVar43;
  RABlockVisitItem RVar44;
  RABlockVisitItem RVar45;
  RABlockVisitItem RVar46;
  long *plStack_4f0;
  ulong uStack_4e8;
  ZoneVectorBase ZStack_4e0;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 uStack_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 uStack_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  uint *puStack_d8;
  ulong uStack_d0;
  size_t sStack_a0;
  ZoneVectorBase *pZStack_98;
  ZoneAllocator *pZStack_88;
  ZoneAllocator *pZStack_80;
  code *pcStack_78;
  ZoneAllocator *pZStack_70;
  ZoneAllocator *pZStack_68;
  ZoneVectorBase *pZStack_60;
  
  if (*(long *)this == 0) {
    pop();
LAB_00128cbb:
    pop();
LAB_00128cc0:
    pop();
LAB_00128cc5:
    pop();
  }
  else {
    lVar18 = *(long *)&this->field_0x10;
    in_RCX = *(ZoneAllocator **)(lVar18 + 0x18);
    if (*(ZoneAllocator **)(*(long *)&this->field_0x8 + 0x10) == in_RCX) goto LAB_00128cbb;
    in_RSI = *(ZoneAllocator **)(lVar18 + 0x10);
    if (in_RSI == in_RCX) goto LAB_00128cc0;
    pZVar7 = in_RCX + -0x10;
    in_R8 = (ZoneAllocator *)(lVar18 + 0x20);
    if (pZVar7 < in_R8) goto LAB_00128cc5;
    if (in_RSI <= pZVar7) {
      auVar4 = *(undefined1 (*) [12])(in_RCX + -0x10);
      *(ZoneAllocator **)(lVar18 + 0x18) = pZVar7;
      if (pZVar7 == in_RSI) {
        ZoneStackBase::_cleanupBlock(&this->super_ZoneStackBase,1,0x110);
      }
      RVar37._12_4_ = 0;
      RVar37._0_12_ = auVar4;
      return RVar37;
    }
  }
  pop();
  pRVar8 = *(RABlock **)&((ZoneVectorBase *)this)->_data;
  uVar15 = extraout_RDX;
  if (pRVar8 == (RABlock *)0x0) {
LAB_00128d49:
    RVar38._8_8_ = uVar15;
    RVar38._block = pRVar8;
    return RVar38;
  }
  if (*(long *)in_RSI == 0) {
    ZoneBitVector::release();
  }
  else {
    uVar13 = ((ZoneVectorBase *)this)->_capacity;
    in_RCX = (ZoneAllocator *)(ulong)uVar13;
    unaff_RBX = (ZoneVectorBase *)this;
    if (7 < uVar13) {
      uVar14 = (ulong)(uVar13 >> 3);
      if (uVar13 < 0x1008) {
        if (uVar13 < 0x408) {
          uVar14 = uVar14 + 0x1fffffffff >> 5;
        }
        else {
          uVar14 = (uVar14 + 0x3fffffff7f >> 6) + 4;
        }
        uVar15 = *(undefined8 *)(in_RSI + (uVar14 & 0xffffffff) * 8 + 8);
        *(undefined8 *)pRVar8 = uVar15;
        *(RABlock **)(in_RSI + (uVar14 & 0xffffffff) * 8 + 8) = pRVar8;
      }
      else {
        ZoneAllocator::_releaseDynamic(in_RSI,pRVar8,uVar14);
        pRVar8 = extraout_RAX;
        uVar15 = extraout_RDX_00;
      }
      *(undefined8 *)&((ZoneVectorBase *)this)->_data = 0;
      ((ZoneVectorBase *)this)->_size = 0;
      ((ZoneVectorBase *)this)->_capacity = 0;
      goto LAB_00128d49;
    }
  }
  ZoneBitVector::release();
  if (((ZoneVectorBase *)this)->_data == (void *)0x0) {
    ZoneStack<asmjit::v1_14::RABlock*>::popFirst();
LAB_00128d9e:
    ZoneStack<asmjit::v1_14::RABlock*>::popFirst();
  }
  else {
    lVar18 = *(long *)&((ZoneVectorBase *)this)->_size;
    in_RCX = *(ZoneAllocator **)(lVar18 + 0x10);
    if (in_RCX == *(ZoneAllocator **)((long)((ZoneVectorBase *)((long)this + 0x10))->_data + 0x18))
    goto LAB_00128d9e;
    pZVar7 = *(ZoneAllocator **)(lVar18 + 0x18);
    if (in_RCX != pZVar7) {
      pRVar8 = *(RABlock **)in_RCX;
      *(ZoneAllocator **)(lVar18 + 0x10) = in_RCX + 8;
      if (in_RCX + 8 == pZVar7) {
        ZoneStackBase::_cleanupBlock(&this->super_ZoneStackBase,0,0x110);
        pZVar7 = extraout_RDX_01;
      }
      RVar39._8_8_ = pZVar7;
      RVar39._block = pRVar8;
      return RVar39;
    }
  }
  ZoneStack<asmjit::v1_14::RABlock*>::popFirst();
  pRVar8 = *(RABlock **)&((ZoneVectorBase *)this)->_data;
  uVar15 = extraout_RDX_02;
  if (pRVar8 != (RABlock *)0x0) {
    if (*(long *)in_RSI == 0) {
      ZoneVector<unsigned_int>::release();
    }
    else {
      uVar13 = ((ZoneVectorBase *)this)->_capacity << 2;
      uVar14 = (ulong)uVar13;
      unaff_RBX = (ZoneVectorBase *)this;
      if (uVar14 != 0) {
        if (uVar13 < 0x201) {
          if (uVar13 < 0x81) {
            uVar14 = uVar14 + 0x1fffffffff >> 5;
          }
          else {
            uVar14 = (uVar14 + 0x3fffffff7f >> 6) + 4;
          }
          uVar15 = *(undefined8 *)(in_RSI + (uVar14 & 0xffffffff) * 8 + 8);
          *(undefined8 *)pRVar8 = uVar15;
          *(RABlock **)(in_RSI + (uVar14 & 0xffffffff) * 8 + 8) = pRVar8;
        }
        else {
          ZoneAllocator::_releaseDynamic(in_RSI,pRVar8,uVar14);
          pRVar8 = extraout_RAX_00;
          uVar15 = extraout_RDX_03;
        }
        *(undefined8 *)&((ZoneVectorBase *)this)->_data = 0;
        ((ZoneVectorBase *)this)->_size = 0;
        ((ZoneVectorBase *)this)->_capacity = 0;
        goto LAB_00128e1f;
      }
    }
    ZoneVector<unsigned_int>::release();
    if (in_RSI < (ZoneAllocator *)(ulong)((ZoneVectorBase *)this)->_size) {
      RVar41._8_8_ = extraout_RDX_04;
      RVar41._block = (RABlock *)((long)in_RSI * 8 + *(long *)&((ZoneVectorBase *)this)->_data);
      return RVar41;
    }
    ZoneVector<asmjit::v1_14::RAWorkReg*>::operator[]();
    uVar34 = *(uint *)(extraout_RDX_05 + 1);
    uVar20 = *(uint *)(in_RCX + 8);
    uVar13 = uVar20 + uVar34;
    pZStack_60 = unaff_RBX;
    if (((ZoneVectorBase *)this)->_capacity < uVar13) goto LAB_00128f8c;
    do {
      pZVar10 = (ZoneAllocator *)((ZoneVectorBase *)this)->_data;
      puVar25 = (uint *)*extraout_RDX_05;
      pZVar17 = *(ZoneAllocator **)in_RCX;
      puVar27 = puVar25 + (ulong)uVar34 * 3;
      in_RSI = pZVar17 + (ulong)uVar20 * 0xc;
      pZVar7 = pZVar10;
      if (uVar20 != 0 && uVar34 != 0) {
        uVar13 = *puVar25;
        pZVar16 = pZVar17;
        pZVar31 = pZVar10;
        do {
          while (uVar34 = *(uint *)(pZVar16 + 4), uVar13 < uVar34) {
            uVar13 = *(uint *)pZVar16;
            while (uVar34 = puVar25[1], uVar34 <= uVar13) {
              pZVar7 = pZVar31 + 0xc;
              unaff_RBP = (ulong)*puVar25;
              *(uint *)pZVar31 = *puVar25;
              *(uint *)(pZVar31 + 4) = uVar34;
              *(uint *)(pZVar31 + 8) = puVar25[2];
              puVar25 = puVar25 + 3;
              pZVar17 = pZVar16;
              pZVar31 = pZVar7;
              if (puVar25 == puVar27) goto LAB_00128f35;
            }
            uVar13 = *puVar25;
            pRVar8 = (RABlock *)0xffffffff;
            if (uVar13 < *(uint *)(pZVar16 + 4)) goto LAB_00128f7e;
          }
          *(uint *)pZVar31 = *(uint *)pZVar16;
          *(uint *)(pZVar31 + 4) = uVar34;
          *(uint *)(pZVar31 + 8) = *(uint *)in_R8;
          pZVar31 = pZVar31 + 0xc;
          pZVar16 = pZVar16 + 0xc;
          pZVar17 = in_RSI;
          pZVar7 = pZVar31;
        } while (pZVar16 != in_RSI);
      }
      for (; puVar25 != puVar27; puVar25 = puVar25 + 3) {
        *(long *)pZVar7 = *(long *)puVar25;
        *(uint *)(pZVar7 + 8) = puVar25[2];
        pZVar7 = pZVar7 + 0xc;
      }
LAB_00128f35:
      if (pZVar17 != in_RSI) {
        uVar13 = *(uint *)in_R8;
        puVar25 = (uint *)(ulong)uVar13;
        do {
          puVar27 = *(uint **)pZVar17;
          *(uint **)pZVar7 = puVar27;
          *(uint *)(pZVar7 + 8) = uVar13;
          pZVar7 = pZVar7 + 0xc;
          pZVar17 = pZVar17 + 0xc;
        } while (pZVar17 != in_RSI);
      }
      uVar26 = SUB82(puVar27,0);
      if (pZVar10 <= pZVar7) {
        pZVar16 = (ZoneAllocator *)(ulong)((ZoneVectorBase *)this)->_capacity;
        in_RSI = pZVar10 + (long)pZVar16 * 0xc;
        if (pZVar7 <= in_RSI) {
          uVar13 = (int)((ulong)((long)pZVar7 - (long)pZVar10) >> 2) * -0x55555555;
          if (((ZoneVectorBase *)this)->_capacity < uVar13) {
            pZStack_68 = (ZoneAllocator *)ZoneVector<asmjit::v1_14::RAWorkReg_*>::operator[];
            RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>>::
            nonOverlappingUnionOf();
            uVar13 = (uint)pZVar10;
            pZStack_68 = (ZoneAllocator *)(ulong)puVar25[2];
            if (in_RSI < pZStack_68) {
              RVar43._8_8_ = extraout_RDX_07;
              RVar43._block = (RABlock *)((long)in_RSI * 8 + *(long *)puVar25);
              return RVar43;
            }
            pZStack_70 = (ZoneAllocator *)0x128fc9;
            ZoneVector<asmjit::v1_14::RAWorkReg*>::operator[]();
            pZStack_70 = (ZoneAllocator *)(ulong)puVar25[2];
            if (in_RSI < pZStack_70) {
              RVar44._block = (RABlock *)((long)in_RSI * 0xc + *(long *)puVar25);
              RVar44._8_8_ = extraout_RDX_08;
              return RVar44;
            }
            pcStack_78 = RAStackAllocator::newSlot;
            ZoneVector<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>>::operator[]();
            pZStack_98 = (ZoneVectorBase *)this;
            pZStack_88 = in_R8;
            pZStack_80 = in_RCX;
            pcStack_78 = (code *)unaff_RBP;
            if ((puVar25[9] == puVar25[8]) &&
               (EVar6 = ZoneVectorBase::_grow
                                  ((ZoneVectorBase *)(puVar25 + 6),*(ZoneAllocator **)puVar25,8,1),
               lVar18 = extraout_RDX_09, EVar6 != 0)) {
LAB_0012908e:
              pRVar8 = (RABlock *)0x0;
LAB_00129081:
              RVar45._8_8_ = lVar18;
              RVar45._block = pRVar8;
              return RVar45;
            }
            pZVar7 = *(ZoneAllocator **)puVar25;
            if (*(long *)pZVar7 == 0) {
              RAStackAllocator::newSlot();
            }
            else {
              pRVar8 = (RABlock *)ZoneAllocator::_alloc(pZVar7,0x14,&sStack_a0);
              lVar18 = extraout_RDX_10;
              if (pRVar8 == (RABlock *)0x0) goto LAB_0012908e;
              *pRVar8 = SUB81((ulong)in_RSI & 0xffffffff,0);
              pRVar8[1] = (RABlock)((char)uVar13 + (uVar13 == 0));
              *(undefined2 *)(pRVar8 + 2) = uVar26;
              *(undefined4 *)(pRVar8 + 8) = 0;
              *(undefined4 *)(pRVar8 + 4) = extraout_EDX;
              *(undefined8 *)(pRVar8 + 0xc) = 0;
              if (uVar13 < puVar25[4]) {
                uVar13 = puVar25[4];
              }
              puVar25[4] = uVar13;
              if (puVar25[8] < puVar25[9]) {
                lVar18 = *(long *)(puVar25 + 6);
                *(RABlock **)(lVar18 + (ulong)puVar25[8] * 8) = pRVar8;
                puVar25[8] = puVar25[8] + 1;
                goto LAB_00129081;
              }
            }
            RAStackAllocator::newSlot();
            uStack_d0 = (ulong)in_RSI & 0xffffffff;
            puStack_d8 = puVar25;
            plVar11 = *(long **)(pZVar7 + 0x18);
            uVar14 = (ulong)*(uint *)(pZVar7 + 0x20);
            if (uVar14 == 0) goto LAB_0012912a;
            plVar21 = (long *)0x0;
            goto LAB_001290c3;
          }
          ((ZoneVectorBase *)this)->_size = uVar13;
          pRVar8 = (RABlock *)0x0;
LAB_00128f7e:
          RVar42._8_8_ = pZVar16;
          RVar42._block = pRVar8;
          return RVar42;
        }
      }
      pZStack_68 = (ZoneAllocator *)0x128f8c;
      RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>>::nonOverlappingUnionOf();
      uVar13 = (uint)pZVar10;
LAB_00128f8c:
      pZStack_68 = (ZoneAllocator *)0x128f99;
      EVar6 = ZoneVectorBase::_growingReserve((ZoneVectorBase *)this,in_RSI,0xc,uVar13);
      pRVar8 = (RABlock *)CONCAT44(extraout_var,EVar6);
      pZVar16 = extraout_RDX_06;
      if (EVar6 != 0) goto LAB_00128f7e;
      uVar34 = *(uint *)(extraout_RDX_05 + 1);
      uVar20 = *(uint *)(in_RCX + 8);
    } while( true );
  }
LAB_00128e1f:
  RVar40._8_8_ = uVar15;
  RVar40._block = pRVar8;
  return RVar40;
  while( true ) {
    uVar13 = 0;
    if (bVar2 != 0) {
      for (; (bVar2 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
      }
    }
    uVar34 = 6;
    if ((char)uVar13 != '\a') {
      uVar34 = uVar13;
    }
    if ((*(byte *)(lVar18 + 2) & 1) == 0) {
      uVar28 = (ulong)(uVar34 & 0xff);
    }
    else {
      uVar28 = (ulong)(byte)((byte)uVar34 ^ 7) * (ulong)*(uint *)(lVar18 + 8) + 0x10;
    }
    if (0xfffffffe < uVar28) {
      uVar28 = 0xffffffff;
    }
    *(int *)(lVar18 + 0xc) = (int)uVar28;
    plVar21 = plVar21 + 1;
    if (uVar14 * 8 - (long)plVar21 == 0) break;
LAB_001290c3:
    lVar18 = *(long *)((long)plVar11 + (long)plVar21);
    bVar2 = *(byte *)(lVar18 + 1);
    if (bVar2 == 0) goto LAB_00129481;
  }
LAB_0012912a:
  lVar18 = 0;
  plVar21 = plVar11 + uVar14;
LAB_00129130:
  do {
    uVar28 = (long)plVar21 - (long)plVar11 >> 3;
    if (7 < uVar28) {
      plVar22 = plVar21 + -1;
      lVar32 = *(long *)((long)plVar11 + (uVar28 & 0xfffffffffffffffe) * 4);
      *(long *)((long)plVar11 + (uVar28 & 0xfffffffffffffffe) * 4) = *plVar11;
      *plVar11 = lVar32;
      lVar3 = plVar11[1];
      lVar29 = plVar21[-1];
      uVar13 = *(uint *)(lVar3 + 0xc);
      uVar34 = *(uint *)(lVar29 + 0xc);
      if (uVar34 < uVar13) {
        plVar11[1] = lVar29;
        *plVar22 = lVar3;
        lVar32 = *plVar11;
        lVar29 = lVar3;
        uVar34 = uVar13;
      }
      uVar13 = *(uint *)(lVar32 + 0xc);
      if (uVar34 < uVar13) {
        *plVar11 = lVar29;
        *plVar22 = lVar32;
        lVar32 = *plVar11;
        uVar13 = *(uint *)(lVar32 + 0xc);
      }
      plVar30 = plVar11 + 1;
      lVar3 = *plVar30;
      if (uVar13 < *(uint *)(lVar3 + 0xc)) {
        plVar11[1] = lVar32;
        *plVar11 = lVar3;
      }
LAB_00129218:
      if (plVar30 < plVar22) break;
      goto LAB_00129232;
    }
    if ((plVar11 != plVar21) && (1 < uVar28)) {
      plVar22 = plVar11 + 1;
      do {
        if (plVar11 < plVar22) {
          lVar3 = *plVar22;
          uVar13 = *(uint *)(lVar3 + 0xc);
          plVar30 = plVar22;
          do {
            lVar29 = plVar30[-1];
            if (*(uint *)(lVar29 + 0xc) <= uVar13) break;
            plVar30[-1] = lVar3;
            *plVar30 = lVar29;
            plVar30 = plVar30 + -1;
          } while (plVar11 < plVar30);
        }
        plVar22 = plVar22 + 1;
      } while (plVar22 < (long *)(((long)plVar21 - (long)plVar11) + (long)plVar11));
    }
    if (lVar18 == 0) {
      uStack_490 = 0;
      uStack_488 = 0;
      uStack_4a0 = 0;
      uStack_498 = 0;
      uStack_4b0 = 0;
      uStack_4a8 = 0;
      uStack_4c0 = 0;
      uStack_4b8 = 0;
      uStack_4d0 = 0;
      uStack_4c8 = 0;
      ZStack_4e0._data = (void *)0x0;
      ZStack_4e0._size = 0;
      ZStack_4e0._capacity = 0;
      uVar28 = 0;
      if (uVar14 == 0) {
        iVar19 = -1;
        goto LAB_0012945a;
      }
      plVar21 = *(long **)(pZVar7 + 0x18);
      plVar11 = plVar21 + uVar14;
      uVar14 = 0;
      goto LAB_001292e2;
    }
    plVar11 = *(long **)((long)&plStack_4f0 + lVar18);
    plVar21 = *(long **)((long)&uStack_4e8 + lVar18);
    lVar18 = lVar18 + -0x10;
  } while( true );
  plVar12 = plVar30 + 1;
  plVar30 = plVar30 + 1;
  if (*(uint *)(*plVar12 + 0xc) < *(uint *)(*plVar11 + 0xc)) goto LAB_00129218;
LAB_00129232:
  do {
    if (plVar22 <= plVar11) break;
    plVar12 = plVar22 + -1;
    plVar22 = plVar22 + -1;
  } while (*(uint *)(*plVar11 + 0xc) < *(uint *)(*plVar12 + 0xc));
  if (plVar30 <= plVar22) {
    lVar3 = *plVar30;
    *plVar30 = *plVar22;
    *plVar22 = lVar3;
    goto LAB_00129218;
  }
  lVar3 = *plVar11;
  *plVar11 = *plVar22;
  *plVar22 = lVar3;
  plVar12 = plVar11;
  plVar33 = plVar21;
  if ((long)plVar21 - (long)plVar30 < (long)plVar22 - (long)plVar11) {
    plVar12 = plVar30;
    plVar30 = plVar11;
    plVar33 = plVar22;
    plVar22 = plVar21;
  }
  *(long **)((long)&ZStack_4e0._data + lVar18) = plVar30;
  *(long **)((long)&ZStack_4e0._size + lVar18) = plVar33;
  if (0x3f0 < lVar18) goto LAB_0012947c;
  lVar18 = lVar18 + 0x10;
  plVar11 = plVar12;
  plVar21 = plVar22;
  goto LAB_00129130;
LAB_001292e2:
  lVar18 = *plVar21;
  if ((*(byte *)(lVar18 + 2) & 2) == 0) {
    bVar2 = *(byte *)(lVar18 + 1);
    uVar34 = -(uint)bVar2 & ((int)uVar14 + (uint)bVar2) - 1;
    uVar13 = *(uint *)(lVar18 + 4);
    uVar23 = (ulong)uVar13;
    if (uVar13 < 0x40) {
      iVar19 = 0;
      if (uVar13 != 0) {
        for (; (uVar13 >> iVar19 & 1) == 0; iVar19 = iVar19 + 1) {
        }
      }
      uVar9 = (ulong)(uint)(iVar19 << 4) | 8;
      do {
        iVar19 = *(int *)((long)&ZStack_4e0._data + uVar9);
        if (iVar19 != 0) {
          uVar24 = iVar19 - 1;
          pZVar10 = (ZoneAllocator *)(ulong)uVar24;
          *(uint *)((long)&ZStack_4e0._data + uVar9) = uVar24;
          uVar20 = *(uint *)(*(long *)((long)&uStack_4e8 + uVar9) + (long)pZVar10 * 8);
          uVar28 = (ulong)uVar20 % (ulong)(uint)bVar2;
          if ((int)uVar28 != 0) goto LAB_0012948b;
          iVar19 = *(int *)(*(long *)((long)&uStack_4e8 + uVar9) + 4 + (long)pZVar10 * 8);
          *(uint *)(lVar18 + 0x10) = uVar20;
          iVar19 = iVar19 - uVar13;
          uVar9 = (ulong)(uVar20 - uVar13);
          bVar36 = true;
          pZVar10 = (ZoneAllocator *)CONCAT71((uint7)(uint3)(uVar24 >> 8),1);
          goto LAB_00129369;
        }
        uVar9 = uVar9 + 0x10;
      } while (uVar9 != 0x68);
    }
    iVar19 = uVar34 - (int)uVar14;
    bVar36 = iVar19 == 0;
    uVar9 = 0;
    pZVar10 = (ZoneAllocator *)0x0;
    uVar14 = (ulong)uVar34;
LAB_00129369:
    if (iVar19 != 0) {
      uVar35 = (ulong)uVar34;
      if (bVar36) {
        uVar35 = uVar9;
      }
      uVar34 = (uint)uVar35;
      uVar20 = iVar19 + uVar34;
      while (uVar13 = (uint)uVar23, uVar34 < uVar20) {
        iVar19 = 0;
        uVar24 = (uint)uVar35;
        if (uVar24 != 0) {
          for (; (uVar24 >> iVar19 & 1) == 0; iVar19 = iVar19 + 1) {
          }
        }
        uVar34 = 1 << ((byte)iVar19 & 0x1f);
        if (uVar20 - uVar24 < uVar34) break;
        uVar9 = (ulong)(uint)(iVar19 << 4);
        this_00 = (ZoneVectorBase *)((long)&ZStack_4e0._data + uVar9);
        uVar13 = *(uint *)((long)&ZStack_4e0._size + uVar9);
        if (uVar13 == *(uint *)((long)&ZStack_4e0._capacity + uVar9)) {
          plStack_4f0 = plVar11;
          uStack_4e8 = uVar14;
          EVar6 = ZoneVectorBase::_grow(this_00,*(ZoneAllocator **)pZVar7,8,1);
          pRVar8 = (RABlock *)CONCAT44(extraout_var_00,EVar6);
          uVar28 = extraout_RDX_11;
          if (EVar6 != 0) goto LAB_0012946a;
          uVar13 = *(uint *)((long)&ZStack_4e0._size + uVar9);
          uVar14 = uStack_4e8;
          plVar11 = plStack_4f0;
        }
        uVar28 = (ulong)uVar34 << 0x20;
        uVar23 = uVar35 | uVar28;
        *(ulong *)((long)this_00->_data + (ulong)uVar13 * 8) = uVar23;
        piVar1 = (int *)((long)&ZStack_4e0._size + uVar9);
        *piVar1 = *piVar1 + 1;
        uVar34 = uVar34 + uVar24;
        uVar35 = (ulong)uVar34;
      }
    }
    if ((char)pZVar10 == '\0') {
      uVar28 = (uVar14 & 0xffffffff) % (ulong)bVar2;
      if ((int)uVar28 != 0) goto LAB_00129486;
      *(int *)(lVar18 + 0x10) = (int)uVar14;
      uVar14 = (ulong)(uint)((int)uVar14 + *(int *)(lVar18 + 4));
    }
  }
  plVar21 = plVar21 + 1;
  if (plVar21 == plVar11) {
    iVar19 = (int)uVar14 + -1;
LAB_0012945a:
    *(int *)(pZVar7 + 0xc) = -*(int *)(pZVar7 + 0x10) & iVar19 + *(int *)(pZVar7 + 0x10);
    pRVar8 = (RABlock *)0x0;
LAB_0012946a:
    RVar46._8_8_ = uVar28;
    RVar46._block = pRVar8;
    return RVar46;
  }
  goto LAB_001292e2;
LAB_0012947c:
  RAStackAllocator::calculateStackFrame();
LAB_00129481:
  uVar13 = (uint)plVar21;
  RAStackAllocator::calculateStackFrame();
  pZVar10 = pZVar7;
LAB_00129486:
  RAStackAllocator::calculateStackFrame();
LAB_0012948b:
  RAStackAllocator::calculateStackFrame();
  uVar34 = *(uint *)(pZVar10 + 0x20);
  uVar14 = extraout_RDX_12;
  if ((ulong)uVar34 != 0) {
    lVar18 = *(long *)(pZVar10 + 0x18);
    uVar14 = 0;
    do {
      if ((*(byte *)(*(long *)(lVar18 + uVar14) + 2) & 2) == 0) {
        piVar1 = (int *)(*(long *)(lVar18 + uVar14) + 0x10);
        *piVar1 = *piVar1 + uVar13;
      }
      uVar14 = uVar14 + 8;
    } while ((ulong)uVar34 << 3 != uVar14);
  }
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar14;
  return (RABlockVisitItem)(auVar5 << 0x40);
}

Assistant:

inline T pop() noexcept {
    ASMJIT_ASSERT(isInitialized());
    ASMJIT_ASSERT(!empty());

    Block* block = _block[kBlockIndexLast];
    ASMJIT_ASSERT(!block->empty());

    T* ptr = block->end<T>();
    T item = *--ptr;
    ASMJIT_ASSERT(ptr >= block->data<T>());
    ASMJIT_ASSERT(ptr >= block->start<T>());

    block->setEnd(ptr);
    if (block->empty())
      _cleanupBlock(kBlockIndexLast, kMidBlockIndex);

    return item;
  }